

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::AddAlgebraicConstraint
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgConPrepare *pr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ptr ppVar2;
  int iVar3;
  AlgConRange rr;
  AlgConRange rr_00;
  size_ty sVar4;
  size_ty sVar5;
  inline_storage<double,_6U> *piVar6;
  inline_storage<int,_6U> *__dest;
  ulong uVar7;
  inline_storage<int,_6U> *__dest_00;
  ulong uVar8;
  inline_storage<double,_6U> *local_c28;
  ulong local_c20;
  inline_storage<double,_6U> local_c10;
  inline_storage<int,_6U> *local_be0;
  ulong local_bd8;
  size_ty local_bd0;
  inline_storage<int,_6U> local_bc8;
  ptr local_bb0;
  inline_storage<double,_6U> *local_ba8;
  ulong local_ba0;
  size_ty local_b98;
  inline_storage<double,_6U> local_b90;
  inline_storage<int,_6U> *local_b60;
  ulong local_b58;
  size_ty local_b50;
  inline_storage<int,_6U> local_b48;
  LinTerms local_b30;
  LinTerms local_ab8;
  LinTerms local_a40;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> local_9c8;
  QuadTerms local_7e0;
  QuadTerms local_6a0;
  QuadAndLinTerms local_560;
  QuadAndLinTerms local_3a8;
  AlgebraicExpression<mp::QuadAndLinTerms> local_1f0;
  
  iVar3 = pr->compl_var;
  if ((pr->qt).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      == 0) {
    if (iVar3 < 0) {
      local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      if (local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
        local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   m_storage;
        local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size =
             (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        if (local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
          memcpy(local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
        }
      }
      else {
        local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
        local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size =
             (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&(pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   m_storage;
        (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      }
      local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      if (local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
        local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage
        ;
        local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size =
             (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
        if (local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
          memcpy(local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                 (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                 local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
        }
      }
      else {
        local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
        local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size =
             (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
        (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&(pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
        (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      }
      rr_00.lb_ = pr->lb;
      rr_00.ub_ = pr->ub;
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)&local_9c8,&local_a40,rr_00,
                 true);
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  *)this,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)&local_9c8);
      if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9c8.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_9c8.super_BasicConstraint.name_.field_2) {
        operator_delete(local_9c8.super_BasicConstraint.name_._M_dataplus._M_p,
                        CONCAT71(local_9c8.super_BasicConstraint.name_.field_2._M_allocated_capacity
                                 ._1_7_,local_9c8.super_BasicConstraint.name_.field_2._M_local_buf
                                        [0]) + 1);
      }
      piVar6 = (inline_storage<double,_6U> *)
               local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      uVar7 = local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      if (6 < local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_a40.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        piVar6 = (inline_storage<double,_6U> *)
                 local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
        uVar7 = local_a40.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      }
    }
    else {
      uVar7 = (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      if (uVar7 < 7) {
        piVar6 = &local_b90;
        local_ba0 = 6;
        sVar4 = (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        local_ba8 = piVar6;
        if (sVar4 != 0) {
          memcpy(piVar6,(pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,sVar4 * 8);
        }
        uVar7 = 6;
      }
      else {
        piVar6 = (inline_storage<double,_6U> *)
                 (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
        sVar4 = (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&(pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   m_storage;
        (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
        local_ba8 = piVar6;
        local_ba0 = uVar7;
      }
      uVar8 = (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_b98 = sVar4;
      if (uVar8 < 7) {
        __dest = &local_b48;
        local_b58 = 6;
        sVar5 = (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_size;
        local_b60 = __dest;
        if (sVar5 != 0) {
          memcpy(__dest,(pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,sVar5 * 4);
        }
        uVar8 = 6;
      }
      else {
        __dest = (inline_storage<int,_6U> *)
                 (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
        sVar5 = (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_size;
        (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&(pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
        (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
        local_b60 = __dest;
        local_b58 = uVar8;
      }
      ppVar2 = (ptr)pr->const_term;
      local_b50 = sVar5;
      if (uVar7 < 7) {
        local_c28 = &local_c10;
        local_c20 = 6;
        if (sVar4 != 0) {
          memcpy(local_c28,piVar6,sVar4 * 8);
        }
      }
      else {
        local_ba8 = &local_b90;
        local_ba0 = 6;
        local_b98 = 0;
        local_c28 = piVar6;
        local_c20 = uVar7;
      }
      if (uVar8 < 7) {
        __dest_00 = &local_bc8;
        local_bd8 = 6;
        local_be0 = __dest_00;
        if (sVar5 != 0) {
          memcpy(__dest_00,__dest,sVar5 * 4);
        }
      }
      else {
        local_b60 = &local_b48;
        local_b58 = 6;
        local_b50 = 0;
        __dest_00 = __dest;
        local_be0 = __dest;
        local_bd8 = uVar8;
      }
      paVar1 = &local_9c8.super_BasicConstraint.name_.field_2;
      local_9c8.super_BasicConstraint.name_._M_string_length = 0;
      local_9c8.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
      local_bd0 = sVar5;
      local_bb0 = ppVar2;
      local_9c8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
      if (uVar7 < 7) {
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)((long)&local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U> + 0x18);
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        piVar6 = local_c28;
        if (sVar4 != 0) {
          memcpy(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                 super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,local_c28,
                 sVar4 * 8);
        }
      }
      else {
        local_c20 = 6;
        piVar6 = &local_c10;
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)local_c28;
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = uVar7;
      }
      local_c28 = piVar6;
      local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = sVar4;
      if (uVar8 < 7) {
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)((long)&local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U> + 0x18);
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        if (sVar5 != 0) {
          memcpy(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                 super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,__dest_00,sVar5 * 4);
        }
      }
      else {
        local_be0 = &local_bc8;
        local_bd8 = 6;
        local_bd0 = 0;
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)__dest_00;
        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = uVar8;
      }
      local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = sVar5;
      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = ppVar2;
      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity._0_4_ = iVar3;
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::AddConstraint_AS_ROOT<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
                ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  *)this,(ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)
                         &local_9c8);
      if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9c8.super_BasicConstraint.name_._M_dataplus._M_p != paVar1) {
        operator_delete(local_9c8.super_BasicConstraint.name_._M_dataplus._M_p,
                        CONCAT71(local_9c8.super_BasicConstraint.name_.field_2._M_allocated_capacity
                                 ._1_7_,local_9c8.super_BasicConstraint.name_.field_2._M_local_buf
                                        [0]) + 1);
      }
      if (6 < local_bd8) {
        operator_delete(local_be0,local_bd8 << 2);
      }
      if (6 < local_c20) {
        operator_delete(local_c28,local_c20 << 3);
      }
      piVar6 = local_ba8;
      uVar7 = local_ba0;
      if (6 < local_b58) {
        operator_delete(local_b60,local_b58 << 2);
        piVar6 = local_ba8;
        uVar7 = local_ba0;
      }
    }
  }
  else if (iVar3 < 0) {
    local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    if (local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      if (local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    }
    local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    if (local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      if (local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    }
    gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    move_initialize<8U,_nullptr>
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &local_6a0,
               (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &pr->qt);
    local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    if (local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      if (local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    }
    local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    if (local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      if (local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    }
    local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    if (local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      if (local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    }
    QuadAndLinTerms::QuadAndLinTerms(&local_3a8,&local_ab8,&local_6a0);
    rr.lb_ = pr->lb;
    rr.ub_ = pr->ub;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)&local_9c8,&local_3a8,rr
               ,true);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
              ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)&local_9c8);
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < CONCAT44(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                     super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                     .m_data.
                     super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                     .m_capacity._4_4_,
                     (int)local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity)) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      CONCAT44(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                               .m_data.
                               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                               .m_capacity._4_4_,
                               (int)local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.
                                    folded_.
                                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                    .m_data.
                                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                                    .m_capacity) << 4);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c8.super_BasicConstraint.name_._M_dataplus._M_p !=
        &local_9c8.super_BasicConstraint.name_.field_2) {
      operator_delete(local_9c8.super_BasicConstraint.name_._M_dataplus._M_p,
                      CONCAT71(local_9c8.super_BasicConstraint.name_.field_2._M_allocated_capacity.
                               _1_7_,local_9c8.super_BasicConstraint.name_.field_2._M_local_buf[0])
                      + 1);
    }
    if (6 < local_3a8.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3a8.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3a8.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3a8.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3a8.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3a8.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3a8.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3a8.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3a8.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_3a8.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_3a8.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_3a8.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_3a8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3a8.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3a8.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3a8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3a8.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3a8.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_6a0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_6a0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_6a0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_6a0.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_6a0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_6a0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    piVar6 = (inline_storage<double,_6U> *)
             local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    uVar7 = local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    if (6 < local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_ab8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      piVar6 = (inline_storage<double,_6U> *)
               local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      uVar7 = local_ab8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    }
  }
  else {
    local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    if (local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      if (local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      (pr->lt).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    }
    local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    if (local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      if (local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      (pr->lt).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    }
    gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    move_initialize<8U,_nullptr>
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &local_7e0,
               (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &pr->qt);
    local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    if (local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      if (local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size =
           (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      (pr->qt).coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    }
    local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    if (local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      if (local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      (pr->qt).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    }
    local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    if (local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      if (local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size =
           (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&(pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 m_storage;
      (pr->qt).vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    }
    QuadAndLinTerms::QuadAndLinTerms(&local_560,&local_b30,&local_7e0);
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&local_1f0,&local_560,pr->const_term);
    ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::
    ComplementarityConstraint(&local_9c8,&local_1f0,pr->compl_var);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AddConstraint_AS_ROOT<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
              ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,&local_9c8);
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < CONCAT44(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                     super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                     .m_data.
                     super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                     .m_capacity._4_4_,
                     (int)local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity)) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      CONCAT44(local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                               .m_data.
                               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                               .m_capacity._4_4_,
                               (int)local_9c8.compl_expr_.super_QuadAndLinTerms.super_QuadTerms.
                                    folded_.
                                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                    .m_data.
                                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                                    .m_capacity) << 4);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_9c8.compl_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c8.super_BasicConstraint.name_._M_dataplus._M_p !=
        &local_9c8.super_BasicConstraint.name_.field_2) {
      operator_delete(local_9c8.super_BasicConstraint.name_._M_dataplus._M_p,
                      CONCAT71(local_9c8.super_BasicConstraint.name_.field_2._M_allocated_capacity.
                               _1_7_,local_9c8.super_BasicConstraint.name_.field_2._M_local_buf[0])
                      + 1);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_560.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_560.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_560.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_560.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_560.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_560.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_560.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_560.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_560.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_560.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_560.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_560.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_560.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_560.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_560.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_560.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_560.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_560.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_7e0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_7e0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_7e0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_7e0.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_7e0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_7e0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    piVar6 = (inline_storage<double,_6U> *)
             local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    uVar7 = local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    if (6 < local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_b30.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      piVar6 = (inline_storage<double,_6U> *)
               local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      uVar7 = local_b30.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    }
  }
  if (6 < uVar7) {
    operator_delete(piVar6,uVar7 << 3);
  }
  return;
}

Assistant:

void AddAlgebraicConstraint(AlgConPrepare&& pr) {
    if (pr.qt.empty()) {
      if (pr.compl_var<0)
        AddConstraint_AS_ROOT( LinConRange{ std::move(pr.lt),
                            { pr.lb, pr.ub }} );
      else
        AddConstraint_AS_ROOT(
              ComplementarityLinear{
                AffineExpr(std::move(pr.lt), pr.const_term), pr.compl_var } );
    } else {
      if (pr.compl_var<0)
        AddConstraint_AS_ROOT( QuadConRange{
                              { std::move(pr.lt), std::move(pr.qt) },
                              { pr.lb, pr.ub }} );
      else
        AddConstraint_AS_ROOT(
              ComplementarityQuadratic{
                QuadraticExpr
                { { std::move(pr.lt), std::move(pr.qt) }, pr.const_term },
                pr.compl_var } );
    }
  }